

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

void Ver_ParsePrintLog(Ver_Man_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  Abc_Obj_t *pObj;
  void *pvVar6;
  undefined8 uVar7;
  char *pcVar8;
  FILE *__stream;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  Abc_Des_t *pAVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char Buffer [1000];
  char local_418 [1000];
  
  pcVar8 = Extra_FileNameGeneric(pMan->pFileName);
  sprintf(local_418,"%s.log",pcVar8);
  if (pcVar8 != (char *)0x0) {
    free(pcVar8);
  }
  __stream = fopen(local_418,"w");
  pVVar9 = pMan->pDesign->vModules;
  iVar10 = pVVar9->nSize;
  lVar11 = (long)iVar10;
  if (0 < lVar11) {
    ppvVar2 = pVVar9->pArray;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar14] + 0xc0) = 0;
      lVar14 = lVar14 + 1;
    } while (lVar11 != lVar14);
    if (0 < iVar10) {
      ppvVar2 = pVVar9->pArray;
      lVar14 = 0;
      do {
        lVar20 = *(long *)((long)ppvVar2[lVar14] + 0x50);
        lVar15 = (long)*(int *)(lVar20 + 4);
        if (0 < lVar15) {
          lVar20 = *(long *)(lVar20 + 8);
          lVar16 = 0;
          do {
            lVar3 = *(long *)(lVar20 + lVar16 * 8);
            if (((*(uint *)(lVar3 + 0x14) & 0xf) != 8) &&
               (lVar3 = *(long *)(lVar3 + 0x38), lVar3 != 0)) {
              piVar1 = (int *)(lVar3 + 0xc0);
              *piVar1 = *piVar1 + 1;
            }
            lVar16 = lVar16 + 1;
          } while (lVar15 != lVar16);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar11);
    }
  }
  uVar13 = 0;
  fprintf(__stream,"The hierarhical design %s contains %d modules:\n",pMan->pFileName);
  pVVar9 = pMan->pDesign->vModules;
  iVar10 = pVVar9->nSize;
  if (0 < iVar10) {
    lVar11 = 0;
    uVar13 = 0;
    do {
      pvVar4 = pVVar9->pArray[lVar11];
      fprintf(__stream,"%-50s : ",*(undefined8 *)((long)pvVar4 + 8));
      if (*(long *)((long)pvVar4 + 8) == 0) {
LAB_00351e36:
        __assert_fail("pNtkBox->pName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
      }
      if (((*(int *)(*(long *)((long)pvVar4 + 0x28) + 4) != 0) ||
          (pcVar8 = "undefbox", *(int *)(*(long *)((long)pvVar4 + 0x30) + 4) != 0)) &&
         (pcVar8 = "blackbox", *(int *)((long)pvVar4 + 4) != 6)) {
        pcVar8 = "logicbox";
      }
      fwrite(pcVar8,8,1,__stream);
      fprintf(__stream," instantiated %6d times ",(ulong)*(uint *)((long)pvVar4 + 0xc0));
      fprintf(__stream," pi = %4d",(ulong)*(uint *)(*(long *)((long)pvVar4 + 0x28) + 4));
      fprintf(__stream," po = %4d",(ulong)*(uint *)(*(long *)((long)pvVar4 + 0x30) + 4));
      fprintf(__stream," nd = %8d",(ulong)*(uint *)((long)pvVar4 + 0x7c));
      fprintf(__stream," lat = %6d",(ulong)*(uint *)((long)pvVar4 + 0x80));
      fprintf(__stream," box = %6d",
              (ulong)(uint)(*(int *)(*(long *)((long)pvVar4 + 0x50) + 4) -
                           *(int *)((long)pvVar4 + 0x80)));
      fputc(10,__stream);
      uVar13 = uVar13 + (*(int *)(*(long *)((long)pvVar4 + 0x30) + 4) == 1);
      lVar11 = lVar11 + 1;
      pVVar9 = pMan->pDesign->vModules;
      iVar10 = pVVar9->nSize;
    } while (lVar11 < iVar10);
    if (0 < iVar10) {
      ppvVar2 = pVVar9->pArray;
      lVar11 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar11] + 0xc0) = 0;
        lVar11 = lVar11 + 1;
      } while (iVar10 != lVar11);
    }
  }
  fprintf(__stream,"The number of modules with one output = %d (%.2f %%).\n",
          ((double)(int)uVar13 * 100.0) / (double)iVar10,(ulong)uVar13);
  pVVar9 = pMan->pDesign->vModules;
  lVar11 = (long)pVVar9->nSize;
  if (1 < lVar11) {
    lVar14 = 0;
    uVar13 = 0;
    do {
      lVar20 = *(long *)((long)pVVar9->pArray[lVar14] + 0x50);
      lVar15 = (long)*(int *)(lVar20 + 4);
      if (0 < lVar15) {
        lVar16 = 0;
        do {
          lVar3 = *(long *)(*(long *)(lVar20 + 8) + lVar16 * 8);
          if (((*(uint *)(lVar3 + 0x14) & 0xf) != 8) &&
             (lVar5 = *(long *)(lVar3 + 0x38), lVar5 != 0)) {
            if (*(long *)(lVar5 + 8) == 0) goto LAB_00351e36;
            iVar10 = *(int *)(*(long *)(lVar5 + 0x28) + 4);
            if ((iVar10 != 0) || (*(int *)(*(long *)(lVar5 + 0x30) + 4) != 0)) {
              lVar19 = (long)*(int *)(*(long *)(lVar3 + 0x40) + 4);
              if (lVar19 < 1) {
                iVar17 = 0;
              }
              else {
                lVar18 = 0;
                iVar17 = 0;
                do {
                  iVar17 = iVar17 + *(int *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar3 + 0x40) +
                                                                          8) + lVar18 * 8) + 8) + 4)
                  ;
                  lVar18 = lVar18 + 1;
                } while (lVar19 != lVar18);
              }
              uVar13 = uVar13 + (iVar17 != iVar10 + *(int *)(*(long *)(lVar5 + 0x30) + 4));
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar15);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar11);
    if (uVar13 == 0) {
      fwrite("The outputs of all box instances are connected.\n",0x30,1,__stream);
    }
    else {
      fputc(10,__stream);
      fprintf(__stream,"The outputs of %d box instances are not connected:\n",(ulong)uVar13);
      pAVar12 = pMan->pDesign;
      pVVar9 = pAVar12->vModules;
      if (0 < pVVar9->nSize) {
        lVar11 = 0;
        do {
          pvVar4 = pVVar9->pArray[lVar11];
          lVar14 = *(long *)((long)pvVar4 + 0x50);
          if (0 < *(int *)(lVar14 + 4)) {
            lVar20 = 0;
            do {
              pObj = *(Abc_Obj_t **)(*(long *)(lVar14 + 8) + lVar20 * 8);
              if (((*(uint *)&pObj->field_0x14 & 0xf) != 8) &&
                 (pvVar6 = (pObj->field_5).pData, pvVar6 != (void *)0x0)) {
                if (*(long *)((long)pvVar6 + 8) == 0) goto LAB_00351e36;
                iVar10 = *(int *)(*(long *)((long)pvVar6 + 0x28) + 4);
                if ((iVar10 != 0) || (*(int *)(*(long *)((long)pvVar6 + 0x30) + 4) != 0)) {
                  lVar15 = (long)*(int *)((long)&((pObj->field_6).pCopy)->pNtk + 4);
                  if (lVar15 < 1) {
                    uVar13 = 0;
                  }
                  else {
                    lVar16 = 0;
                    uVar13 = 0;
                    do {
                      uVar13 = uVar13 + *(int *)((&((pObj->field_6).pCopy)->pNext->pNtk)[lVar16]->
                                                 pName + 4);
                      lVar16 = lVar16 + 1;
                    } while (lVar15 != lVar16);
                  }
                  if (uVar13 != iVar10 + *(int *)(*(long *)((long)pvVar6 + 0x30) + 4)) {
                    uVar7 = *(undefined8 *)((long)pvVar4 + 8);
                    pcVar8 = Abc_ObjName(pObj);
                    fprintf(__stream,
                            "In module \"%s\" instance \"%s\" of box \"%s\" has different numbers of actual/formal nets (%d/%d).\n"
                            ,uVar7,pcVar8,*(undefined8 *)((long)pvVar6 + 8),(ulong)uVar13,
                            *(int *)(*(long *)((long)pvVar6 + 0x30) + 4) +
                            *(int *)(*(long *)((long)pvVar6 + 0x28) + 4));
                    lVar14 = *(long *)((long)pvVar4 + 0x50);
                  }
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < *(int *)(lVar14 + 4));
            pAVar12 = pMan->pDesign;
          }
          lVar11 = lVar11 + 1;
          pVVar9 = pAVar12->vModules;
        } while (lVar11 < pVVar9->nSize);
      }
    }
  }
  fclose(__stream);
  printf("Hierarchy statistics can be found in log file \"%s\".\n",local_418);
  return;
}

Assistant:

void Ver_ParsePrintLog( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pBox;
    FILE * pFile;
    char * pNameGeneric;
    char Buffer[1000];
    int i, k, Count1 = 0;

    // open the log file
    pNameGeneric = Extra_FileNameGeneric( pMan->pFileName );
    sprintf( Buffer, "%s.log", pNameGeneric );
    ABC_FREE( pNameGeneric );
    pFile = fopen( Buffer, "w" );

    // count the total number of instances and how many times they occur
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            pNtkBox = (Abc_Ntk_t *)pBox->pData;
            if ( pNtkBox == NULL )
                continue;
            pNtkBox->fHieVisited++;
        }